

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void deferred_ping(void *arg,void *arg2)

{
  char *pcVar1;
  char cVar2;
  fio_defer_task_s task;
  fio_data_s *pfVar3;
  int *piVar4;
  ulong uVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  fio_lock_i ret;
  
  pfVar3 = fio_data;
  lVar8 = (long)(int)((ulong)arg >> 8) * 0xa8;
  if (*(long *)((long)fio_data + lVar8 + 0x58) == 0) {
    return;
  }
  uVar5 = (ulong)*(byte *)((long)fio_data + lVar8 + 0x6a);
  if ((uVar5 != 0) &&
     ((fio_data->last_cycle).tv_sec < (long)(uVar5 + *(long *)((long)fio_data + lVar8 + 0x60)))) {
    return;
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  LOCK();
  pcVar1 = (char *)((long)pfVar3 + lVar8 + 0x6c);
  cVar2 = *pcVar1;
  *pcVar1 = '\x01';
  UNLOCK();
  if (cVar2 == '\0') {
    lVar7 = *(long *)((long)fio_data + lVar8 + 0x58);
    if (lVar7 == 0) {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar8 + 0x6c) = 0;
      UNLOCK();
      lVar7 = 0;
      *piVar4 = 9;
      goto LAB_0012b35f;
    }
    LOCK();
    cVar2 = *(char *)(lVar7 + 0x29);
    *(char *)(lVar7 + 0x29) = '\x01';
    UNLOCK();
    puVar6 = (undefined1 *)((long)fio_data + lVar8 + 0x6c);
    if (cVar2 == '\0') {
      LOCK();
      *puVar6 = 0;
      UNLOCK();
      goto LAB_0012b35f;
    }
    LOCK();
    *puVar6 = 0;
    UNLOCK();
  }
  *piVar4 = 0xb;
  lVar7 = 0;
LAB_0012b35f:
  if (lVar7 == 0) {
    task.arg1 = arg;
    task.func = deferred_ping;
    task.arg2 = (void *)0x0;
    fio_defer_push_task_fn(task,&task_queue_normal);
  }
  else {
    (**(code **)(lVar7 + 0x20))(arg,lVar7);
    LOCK();
    *(undefined1 *)(lVar7 + 0x29) = 0;
    UNLOCK();
  }
  return;
}

Assistant:

static void deferred_ping(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol ||
      (uuid_data(arg).timeout &&
       (uuid_data(arg).timeout + uuid_data(arg).active >
        (fio_data->last_cycle.tv_sec)))) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_WRITE);
  if (!pr)
    goto postpone;
  pr->ping((intptr_t)arg, pr);
  protocol_unlock(pr, FIO_PR_LOCK_WRITE);
  return;
postpone:
  fio_defer_push_task(deferred_ping, arg, NULL);
  (void)arg2;
}